

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O3

void __thiscall
embree::cache_regression_test::thread_alloc(cache_regression_test *this,cache_regression_test *This)

{
  atomic<int> *paVar1;
  long *plVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  size_t j;
  cache_regression_test *this_00;
  uint uVar9;
  cache_regression_test *pcVar10;
  ulong *puVar11;
  bool bVar12;
  size_t N;
  size_t elt;
  cache_regression_test *local_78;
  ulong local_70;
  cache_regression_test *local_68;
  ulong local_60;
  cache_regression_test *local_58;
  BarrierSys *local_50;
  CacheEntry *local_48;
  anon_class_16_2_fa5d65c8 local_40;
  
  LOCK();
  paVar1 = &this->threadIDCounter;
  uVar8 = (ulong)(uint)(paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pcVar10 = (cache_regression_test *)(DAT_021b95c0 >> 2);
  local_50 = &this->barrier;
  BarrierSys::wait(local_50,This);
  local_48 = this->entry;
  local_58 = this;
  lVar5 = __tls_get_addr(&PTR_021a6e08);
  plVar2 = (long *)(lVar5 + 8);
  lVar5 = 0;
  local_68 = pcVar10;
  local_60 = uVar8;
  do {
    uVar9 = (int)uVar8 + (int)lVar5 & 0xfff;
    local_70 = (ulong)uVar9;
    local_40.elt = &local_70;
    local_78 = (cache_regression_test *)(ulong)((uVar9 % 1000) * 10 + 1);
    if (pcVar10 <= local_78) {
      local_78 = pcVar10;
    }
    this_00 = (cache_regression_test *)*plVar2;
    local_40.N = (size_t *)&local_78;
    if (this_00 == (cache_regression_test *)0x0) {
      local_40.N = (size_t *)&local_78;
      SharedLazyTessellationCache::getNextRenderThreadWorkState
                ((SharedLazyTessellationCache *)
                 &SharedLazyTessellationCache::sharedLazyTessellationCache);
      this_00 = (cache_regression_test *)*plVar2;
      uVar8 = local_60;
      pcVar10 = local_68;
    }
    puVar11 = (ulong *)((long)&(local_48->tag).data.super_atomic<long>.super___atomic_base<long>.
                               _M_i + (ulong)(uVar9 << 4));
LAB_00d5647d:
    LOCK();
    pp_Var3 = (this_00->super_RegressionTest)._vptr_RegressionTest;
    (this_00->super_RegressionTest)._vptr_RegressionTest =
         (_func_int **)((long)(this_00->super_RegressionTest)._vptr_RegressionTest + 1);
    UNLOCK();
    if ((_func_int **)0x3 < pp_Var3) {
      thread_alloc(this_00);
      uVar8 = local_60;
      pcVar10 = local_68;
    }
    uVar4 = *puVar11;
    if ((uVar4 != 0) &&
       (piVar6 = (int *)((uVar4 & 0xffffffffff) +
                        SharedLazyTessellationCache::sharedLazyTessellationCache),
       piVar6 != (int *)0x0 && DAT_021b94c0 <= ((long)uVar4 >> 0x28) + 7U)) goto LAB_00d5656c;
    if ((puVar11[1] & 1) != 0) {
LAB_00d564f9:
      LOCK();
      (this_00->super_RegressionTest)._vptr_RegressionTest =
           (_func_int **)((long)(this_00->super_RegressionTest)._vptr_RegressionTest + -1);
      UNLOCK();
      goto LAB_00d5647d;
    }
    LOCK();
    bVar12 = (char)puVar11[1] == '\0';
    if (bVar12) {
      *(char *)(puVar11 + 1) = '\x01';
    }
    UNLOCK();
    if (!bVar12) goto LAB_00d564f9;
    if ((*puVar11 != 0) && (DAT_021b94c0 <= ((long)*puVar11 >> 0x28) + 7U)) {
      *(undefined1 *)(puVar11 + 1) = 0;
      goto LAB_00d564f9;
    }
    piVar6 = thread_alloc::anon_class_16_2_fa5d65c8::operator()(&local_40);
    uVar8 = DAT_021b94c0 << 0x28 |
            (long)piVar6 - SharedLazyTessellationCache::sharedLazyTessellationCache;
    if (piVar6 == (int *)0x0) {
      uVar8 = 0;
    }
    LOCK();
    *puVar11 = uVar8;
    UNLOCK();
    *(undefined1 *)(puVar11 + 1) = 0;
    uVar8 = local_60;
    pcVar10 = local_68;
LAB_00d5656c:
    if (piVar6 == (int *)0x0) {
      plVar7 = (long *)*plVar2;
      if (plVar7 == (long *)0x0) {
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
        plVar7 = (long *)*plVar2;
        uVar8 = local_60;
        pcVar10 = local_68;
      }
      LOCK();
      *plVar7 = *plVar7 + -1;
      UNLOCK();
      LOCK();
      (local_58->numFailed).super___atomic_base<unsigned_long>._M_i =
           (local_58->numFailed).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    else {
      if (local_78 != (cache_regression_test *)0x0) {
        This = (cache_regression_test *)0x0;
        do {
          if (piVar6[(long)This] != (int)local_70) {
            LOCK();
            (local_58->numFailed).super___atomic_base<unsigned_long>._M_i =
                 (local_58->numFailed).super___atomic_base<unsigned_long>._M_i + 1;
            UNLOCK();
            break;
          }
          This = (cache_regression_test *)
                 ((long)&(This->super_RegressionTest)._vptr_RegressionTest + 1);
        } while (local_78 != This);
      }
      plVar7 = (long *)*plVar2;
      if (plVar7 == (long *)0x0) {
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
        plVar7 = (long *)*plVar2;
        uVar8 = local_60;
        pcVar10 = local_68;
      }
      LOCK();
      *plVar7 = *plVar7 + -1;
      UNLOCK();
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 100000) {
      BarrierSys::wait(local_50,This);
      return;
    }
  } while( true );
}

Assistant:

static void thread_alloc(cache_regression_test* This)
    {
      int threadID = This->threadIDCounter++;
      size_t maxN = SharedLazyTessellationCache::sharedLazyTessellationCache.maxAllocSize()/4;
      This->barrier.wait();

      for (size_t j=0; j<100000; j++)
      {
        size_t elt = (threadID+j)%numEntries;
        size_t N = min(1+10*(elt%1000),maxN);
          
        volatile int* data = (volatile int*) SharedLazyTessellationCache::lookup(This->entry[elt],0,[&] () {
            int* data = (int*) SharedLazyTessellationCache::sharedLazyTessellationCache.malloc(4*N);
            for (size_t k=0; k<N; k++) data[k] = (int)elt;
            return data;
          });
        
        if (data == nullptr) {
          SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
          This->numFailed++;
          continue;
        }
            
        /* check memory block */
        for (size_t k=0; k<N; k++) {
          if (data[k] != (int)elt) {
            This->numFailed++;
            break;
          }
        }
        
        SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
      }
      This->barrier.wait();
    }